

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UIPathTracer.cpp
# Opt level: O1

void UI::PathTracerStartModal(shared_ptr<PathTracerThread> *path_tracer_thread)

{
  element_type *peVar1;
  bool bVar2;
  ImGuiStyle *pIVar3;
  float fVar4;
  int bounce;
  int height;
  int width;
  int local_2c;
  int local_28;
  int local_24;
  ImVec2 local_20;
  
  ImGui::SetNextWindowCentering();
  bVar2 = ImGui::BeginPopupModal("Start PathTracer",(bool *)0x0,0x45);
  if (bVar2) {
    peVar1 = (((path_tracer_thread->super___shared_ptr<PathTracerThread,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr)->m_path_tracer_viewer_ptr).
             super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_24 = *(int *)((long)(peVar1->m_path_tracer_ptr).
                              super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                       0x1a8);
    fVar4 = ImGui::CalcItemWidth();
    ImGui::PushMultiItemsWidths(2,fVar4);
    bVar2 = ImGui::DragInt("Width",&local_24,1.0,0x100,0xf00,"%d",0);
    if (bVar2) {
      *(int *)((long)(peVar1->m_path_tracer_ptr).
                     super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x1a8) =
           local_24;
    }
    ImGui::PopItemWidth();
    ImGui::SameLine(0.0,-1.0);
    local_28 = *(int *)((long)(peVar1->m_path_tracer_ptr).
                              super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                       0x1ac);
    bVar2 = ImGui::DragInt("Height",&local_28,1.0,0x100,0xf00,"%d",0);
    if (bVar2) {
      *(int *)((long)(peVar1->m_path_tracer_ptr).
                     super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x1ac) =
           local_28;
    }
    ImGui::PopItemWidth();
    local_2c = *(int *)((long)(peVar1->m_path_tracer_ptr).
                              super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                       0x1b0);
    bVar2 = ImGui::DragInt("Bounce",&local_2c,1.0,2,0x10,"%d",0);
    if (bVar2) {
      *(int *)((long)(peVar1->m_path_tracer_ptr).
                     super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x1b0) =
           local_2c;
    }
    fVar4 = ImGui::GetWindowContentRegionWidth();
    pIVar3 = ImGui::GetStyle();
    fVar4 = (fVar4 - (pIVar3->ItemSpacing).x) * 0.5;
    local_20.y = 0.0;
    local_20.x = fVar4;
    bVar2 = ImGui::Button("Start",&local_20);
    if (bVar2) {
      PathTracerThread::Launch
                ((path_tracer_thread->
                 super___shared_ptr<PathTracerThread,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
      ImGui::CloseCurrentPopup();
    }
    ImGui::SetItemDefaultFocus();
    ImGui::SameLine(0.0,-1.0);
    local_20.y = 0.0;
    local_20.x = fVar4;
    bVar2 = ImGui::Button("Cancel",&local_20);
    if (bVar2) {
      ImGui::CloseCurrentPopup();
    }
    ImGui::EndPopup();
  }
  return;
}

Assistant:

void PathTracerStartModal(const std::shared_ptr<PathTracerThread> &path_tracer_thread) {
	ImGui::SetNextWindowCentering();
	if (ImGui::BeginPopupModal(kPathTracerStartModal, nullptr,
	                           ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar |
	                               ImGuiWindowFlags_NoMove)) {
		const auto &path_tracer = path_tracer_thread->GetPathTracerViewerPtr()->GetPathTracerPtr();

		int width = path_tracer->m_width;
		ImGui::PushMultiItemsWidths(2, ImGui::CalcItemWidth());
		if (ImGui::DragInt("Width", &width, 1, kMinWidth, kMaxWidth))
			path_tracer->m_width = width;
		ImGui::PopItemWidth();
		ImGui::SameLine();
		int height = path_tracer->m_height;
		if (ImGui::DragInt("Height", &height, 1, kMinHeight, kMaxHeight))
			path_tracer->m_height = height;
		ImGui::PopItemWidth();

		int bounce = path_tracer->m_bounce;
		if (ImGui::DragInt("Bounce", &bounce, 1, kMinBounce, kMaxBounce))
			path_tracer->m_bounce = bounce;

		float button_width = (ImGui::GetWindowContentRegionWidth() - ImGui::GetStyle().ItemSpacing.x) * 0.5f;

		if (ImGui::Button("Start", {button_width, 0})) {
			path_tracer_thread->Launch();

			ImGui::CloseCurrentPopup();
		}
		ImGui::SetItemDefaultFocus();
		ImGui::SameLine();
		if (ImGui::Button("Cancel", {button_width, 0}))
			ImGui::CloseCurrentPopup();

		ImGui::EndPopup();
	}
}